

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

Symbol __thiscall
google::protobuf::DescriptorBuilder::FindSymbol(DescriptorBuilder *this,string *name,bool build_it)

{
  pointer file_00;
  undefined1 auVar1 [16];
  bool bVar2;
  size_type sVar3;
  DescriptorBuilder *pDVar4;
  DescriptorBuilder *this_00;
  DescriptorBuilder *pDVar5;
  Symbol *this_01;
  Symbol SVar6;
  FileDescriptor *file;
  Symbol result;
  FileDescriptor *local_40;
  Symbol local_38;
  
  SVar6 = FindSymbolNotEnforcingDeps(this,name,build_it);
  local_38.field_1 = SVar6.field_1;
  local_38.type = SVar6.type;
  if (local_38.type == NULL_SYMBOL) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_38.field_1;
    return (Symbol)(auVar1 << 0x40);
  }
  if (this->pool_->enforce_dependencies_ != true) {
    return SVar6;
  }
  this_01 = &local_38;
  local_40 = Symbol::GetFile(this_01);
  if (local_40 != this->file_) {
    this_00 = (DescriptorBuilder *)&this->dependencies_;
    sVar3 = std::
            set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            ::count((set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                     *)this_00,&local_40);
    if (sVar3 == 0) {
      if (local_38.type == PACKAGE) {
        bVar2 = IsInPackage(this_00,this->file_,name);
        if (bVar2) goto LAB_0029f3d4;
        pDVar5 = (DescriptorBuilder *)
                 (this->dependencies_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        while (pDVar5 != (DescriptorBuilder *)
                         &(this->dependencies_)._M_t._M_impl.super__Rb_tree_header) {
          file_00 = (pDVar5->options_to_interpret_).
                    super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if ((file_00 != (pointer)0x0) &&
             (bVar2 = IsInPackage(this_00,(FileDescriptor *)file_00,name), bVar2))
          goto LAB_0029f3d4;
          pDVar4 = (DescriptorBuilder *)std::_Rb_tree_increment((_Rb_tree_node_base *)pDVar5);
          this_00 = pDVar5;
          pDVar5 = pDVar4;
        }
      }
      this->possible_undeclared_dependency_ = local_40;
      std::__cxx11::string::_M_assign((string *)&this->possible_undeclared_dependency_name_);
      this_01 = (Symbol *)&(anonymous_namespace)::kNullSymbol;
    }
  }
LAB_0029f3d4:
  SVar6._4_4_ = 0;
  SVar6.type = this_01->type;
  SVar6.field_1.descriptor = (this_01->field_1).descriptor;
  return SVar6;
}

Assistant:

Symbol DescriptorBuilder::FindSymbol(const std::string& name, bool build_it) {
  Symbol result = FindSymbolNotEnforcingDeps(name, build_it);

  if (result.IsNull()) return result;

  if (!pool_->enforce_dependencies_) {
    // Hack for CompilerUpgrader, and also used for lazily_build_dependencies_
    return result;
  }

  // Only find symbols which were defined in this file or one of its
  // dependencies.
  const FileDescriptor* file = result.GetFile();
  if (file == file_ || dependencies_.count(file) > 0) {
    return result;
  }

  if (result.type == Symbol::PACKAGE) {
    // Arg, this is overcomplicated.  The symbol is a package name.  It could
    // be that the package was defined in multiple files.  result.GetFile()
    // returns the first file we saw that used this package.  We've determined
    // that that file is not a direct dependency of the file we are currently
    // building, but it could be that some other file which *is* a direct
    // dependency also defines the same package.  We can't really rule out this
    // symbol unless none of the dependencies define it.
    if (IsInPackage(file_, name)) return result;
    for (std::set<const FileDescriptor*>::const_iterator it =
             dependencies_.begin();
         it != dependencies_.end(); ++it) {
      // Note:  A dependency may be nullptr if it was not found or had errors.
      if (*it != nullptr && IsInPackage(*it, name)) return result;
    }
  }

  possible_undeclared_dependency_ = file;
  possible_undeclared_dependency_name_ = name;
  return kNullSymbol;
}